

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O0

bool __thiscall bsplib::A2A::recv_pop(A2A *this,int src_pid,size_t size)

{
  value_type vVar1;
  reference pvVar2;
  bool bVar3;
  size_t o;
  size_t size_local;
  int src_pid_local;
  A2A *this_local;
  
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_recv_pos,(long)src_pid);
  vVar1 = *pvVar2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_recv_sizes,(long)src_pid);
  bVar3 = size <= *pvVar2 - vVar1;
  if (bVar3) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_recv_pos,(long)src_pid);
    *pvVar2 = size + *pvVar2;
  }
  return bVar3;
}

Assistant:

bool recv_pop( int src_pid, std::size_t size ){
        std::size_t o = m_recv_pos[src_pid];
        if ( m_recv_sizes[src_pid] - o  >= size ) {
            m_recv_pos[src_pid] += size;
            return true;
        }
        else {
            return false;
        }
    }